

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

ExprP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::ContainerExprPBase<tcu::Vector<float,_2>_>::operator[]
          (ContainerExprPBase<tcu::Vector<float,_2>_> *this,int i)

{
  int in_EDX;
  SharedPtrStateBase *extraout_RDX;
  undefined4 in_register_00000034;
  ExprP<float> EVar1;
  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> SStack_28;
  
  exprP<tcu::Vector<float,2>>
            ((BuiltinPrecisionTests *)&SStack_28,
             (SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_> *)
             CONCAT44(in_register_00000034,i));
  Functions::getComponent<tcu::Vector<float,2>>
            ((Functions *)this,(ExprP<tcu::Vector<float,_2>_> *)&SStack_28,in_EDX);
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_2>_>_>::release
            (&SStack_28);
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_state = extraout_RDX;
  EVar1.super_ExprPBase<float>.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>
  .m_ptr = (Expr<float> *)this;
  return (ExprP<float>)
         EVar1.super_ExprPBase<float>.
         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<float>_>;
}

Assistant:

ExprP<typename T::Element> ContainerExprPBase<T>::operator[] (int i) const
{
	return Functions::getComponent(exprP<T>(*this), i);
}